

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.h
# Opt level: O0

void __thiscall Rml::TextureSource::~TextureSource(TextureSource *this)

{
  TextureSource *this_local;
  
  itlib::
  flat_map<Rml::RenderManager_*,_Rml::Texture,_itlib::fmimpl::less,_std::vector<std::pair<Rml::RenderManager_*,_Rml::Texture>,_std::allocator<std::pair<Rml::RenderManager_*,_Rml::Texture>_>_>_>
  ::~flat_map(&this->textures);
  ::std::__cxx11::string::~string((string *)&this->document_path);
  ::std::__cxx11::string::~string((string *)this);
  NonCopyMoveable::~NonCopyMoveable((NonCopyMoveable *)this);
  return;
}

Assistant:

class RMLUICORE_API TextureSource : NonCopyMoveable {
public:
	TextureSource() = default;
	TextureSource(String source, String document_path);

	Texture GetTexture(RenderManager& render_manager) const;

	const String& GetSource() const;
	const String& GetDefinitionSource() const;

private:
	String source;
	String document_path;
	mutable SmallUnorderedMap<RenderManager*, Texture> textures;
}